

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O2

void __thiscall
Scine::Core::ModuleManager::Impl::load(Impl *this,shared_ptr<Scine::Core::Module> *module)

{
  bool bVar1;
  LibraryAndModules lib;
  __shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2> local_40;
  LibraryAndModules local_30;
  
  std::__shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&module->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>)
  ;
  LibraryAndModules::LibraryAndModules(&local_30,(ModulePtr *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<Scine::Core::Module>*,std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>,Scine::Core::ModuleManager::Impl::load(std::shared_ptr<Scine::Core::Module>)::_lambda(auto:1_const&)_1_>
                    ((__normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                      )local_30.modules.
                       super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                      )local_30.modules.
                       super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (anon_class_8_1_8991fb9c_for__M_pred)this);
  if (!bVar1) {
    std::
    vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
    ::emplace_back<Scine::Core::ModuleManager::Impl::LibraryAndModules>(&this->_sources,&local_30);
  }
  LibraryAndModules::~LibraryAndModules(&local_30);
  return;
}

Assistant:

void load(std::shared_ptr<Module> module) {
    LibraryAndModules lib{module};

    const bool alreadyLoaded = std::any_of(std::begin(lib.modules), std::end(lib.modules),
                                           [&](const auto& modulePtr) -> bool { return moduleLoaded(modulePtr->name()); });

    if (!alreadyLoaded) {
      _sources.push_back(std::move(lib));
    }
  }